

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

void workspace_hide(natwm_state *state,workspace *workspace)

{
  client *client_00;
  client *client;
  node *node;
  workspace *workspace_local;
  natwm_state *state_local;
  
  if ((workspace->is_visible & 1U) != 0) {
    workspace->is_focused = false;
    workspace->is_visible = false;
    for (client = (client *)workspace->clients->head; client != (client *)0x0;
        client = *(client **)client) {
      client_00 = get_client_from_client_node((node *)client);
      if ((client_00 != (client *)0x0) && ((client_00->state & CLIENT_HIDDEN) == 0)) {
        client_hide(state,client_00);
      }
    }
  }
  return;
}

Assistant:

static void workspace_hide(const struct natwm_state *state, struct workspace *workspace)
{
        if (!workspace->is_visible) {
                return;
        }

        workspace->is_focused = false;
        workspace->is_visible = false;

        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL || client->state & CLIENT_HIDDEN) {
                        continue;
                }

                client_hide(state, client);
        }
}